

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_rawseti(lua_State *L,int idx,int n)

{
  uint uVar1;
  TValue *pTVar2;
  anon_struct_8_2_fd66bcdd_for_TValue_2 aVar3;
  TValue *pTVar4;
  ulong uVar5;
  GCobj *o;
  GCtab *t;
  
  pTVar4 = index2adr(L,idx);
  uVar1 = (pTVar4->u32).lo;
  t = (GCtab *)(ulong)uVar1;
  if ((uint)n < t->asize) {
    pTVar4 = (TValue *)((ulong)(t->array).ptr32 + (long)n * 8);
  }
  else {
    pTVar4 = lj_tab_setinth(L,t,n);
  }
  pTVar2 = L->top;
  aVar3 = pTVar2[-1].field_2;
  pTVar4->field_2 = aVar3;
  if (((aVar3.it + 0xd < 9) && ((*(byte *)(((ulong)aVar3 & 0xffffffff) + 4) & 3) != 0)) &&
     ((t->marked & 4) != 0)) {
    uVar5 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
    *(uint *)(uVar5 + 0x3c) = uVar1;
  }
  L->top = pTVar2 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  api_checknelems(L, 1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}